

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_restriction(lysp_yin_ctx *ctx,ly_stmt restr_kw,lysp_restr *restr)

{
  yin_argument arg_type_00;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_argument arg_type;
  yin_subelement subelems [5];
  lysp_restr *restr_local;
  ly_stmt restr_kw_local;
  lysp_yin_ctx *ctx_local;
  
  ret__ = 0x80000;
  subelems[0]._0_8_ = &restr->dsc;
  subelems[0].dest._0_2_ = 2;
  subelems[0].flags = 0;
  subelems[0]._18_2_ = 0xc;
  subelems[1]._0_8_ = &restr->eapptag;
  subelems[1].dest._0_2_ = 2;
  subelems[1].flags = 0;
  subelems[1]._18_2_ = 0xd;
  subelems[2]._0_8_ = &restr->emsg;
  subelems[2].dest._0_2_ = 2;
  subelems[2].flags = 0;
  subelems[2]._18_2_ = 0x27;
  subelems[3]._0_8_ = &restr->ref;
  subelems[3].dest._0_2_ = 2;
  memset(&subelems[3].flags,0,0x18);
  subelems[3].flags = 0;
  subelems[3]._18_2_ = 0xf;
  arg_type_00 = YIN_ARG_VALUE;
  if (restr_kw == LY_STMT_MUST) {
    arg_type_00 = YIN_ARG_CONDITION;
  }
  else if ((restr_kw != LY_STMT_LENGTH) && (restr_kw != LY_STMT_RANGE)) {
    __assert_fail("restr_kw == LY_STMT_MUST || restr_kw == LY_STMT_LENGTH || restr_kw == LY_STMT_RANGE"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0x3f1,
                  "LY_ERR yin_parse_restriction(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_restr *)"
                 );
  }
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ = yin_parse_attribute(ctx,arg_type_00,(char **)restr,Y_STR_ARG,restr_kw),
     ctx_local._4_4_ == LY_SUCCESS)) {
    (restr->arg).mod =
         (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    ctx_local._4_4_ =
         yin_parse_content(ctx,(yin_subelement *)&ret__,5,restr,restr_kw,(char **)0x0,&restr->exts);
    if ((ctx_local._4_4_ == LY_SUCCESS) &&
       (ctx_local._4_4_ = yin_unres_exts_add(ctx,restr->exts), ctx_local._4_4_ == LY_SUCCESS)) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_restriction(struct lysp_yin_ctx *ctx, enum ly_stmt restr_kw, struct lysp_restr *restr)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_DESCRIPTION, &restr->dsc, YIN_SUBELEM_UNIQUE},
        {LY_STMT_ERROR_APP_TAG, &restr->eapptag, YIN_SUBELEM_UNIQUE},
        {LY_STMT_ERROR_MESSAGE, &restr->emsg, YIN_SUBELEM_UNIQUE},
        {LY_STMT_REFERENCE, &restr->ref, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };
    /* argument of must is called condition, but argument of length and range is called value */
    enum yin_argument arg_type = (restr_kw == LY_STMT_MUST) ? YIN_ARG_CONDITION : YIN_ARG_VALUE;

    assert(restr_kw == LY_STMT_MUST || restr_kw == LY_STMT_LENGTH || restr_kw == LY_STMT_RANGE);

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, arg_type, &restr->arg.str, Y_STR_ARG, restr_kw));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), restr, restr_kw, NULL, &restr->exts));

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, restr->exts));

    return LY_SUCCESS;
}